

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

Abc_Cex_t * Saig_PhaseTranslateCex(Aig_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int nFrames;
  int iFrame;
  int k;
  int i;
  Abc_Cex_t *pNew;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *p_local;
  
  iVar4 = pCex->nPis;
  iVar1 = Saig_ManPiNum(p);
  if (iVar4 % iVar1 == 0) {
    iVar4 = pCex->nPis;
    iVar2 = Saig_ManPiNum(p);
    iVar1 = pCex->iFrame;
    iVar5 = pCex->iPo;
    iVar3 = Saig_ManPoNum(p);
    iVar4 = iVar1 * (iVar4 / iVar2) + iVar5 / iVar3;
    iVar1 = Saig_ManRegNum(p);
    iVar5 = Saig_ManPiNum(p);
    p_local = (Aig_Man_t *)Abc_CexAlloc(iVar1,iVar5,iVar4 + 1);
    if (*(int *)&p_local->vCis !=
        *(int *)((long)&p_local->pSpec + 4) * (iVar4 + 1) + *(int *)&p_local->pSpec) {
      __assert_fail("pNew->nBits == pNew->nPis * (iFrame + 1) + pNew->nRegs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x427,"Abc_Cex_t *Saig_PhaseTranslateCex(Aig_Man_t *, Abc_Cex_t *)");
    }
    *(int *)((long)&p_local->pName + 4) = iVar4;
    iVar4 = pCex->iPo;
    iVar1 = Saig_ManPoNum(p);
    *(int *)&p_local->pName = iVar4 % iVar1;
    iFrame = pCex->nRegs;
    for (nFrames = *(int *)&p_local->pSpec; nFrames < *(int *)&p_local->vCis; nFrames = nFrames + 1)
    {
      iVar4 = Abc_InfoHasBit((uint *)(pCex + 1),iFrame);
      if (iVar4 != 0) {
        Abc_InfoSetBit((uint *)((long)&p_local->vCis + 4),nFrames);
      }
      iFrame = iFrame + 1;
    }
    if (pCex->nBits < iFrame) {
      __assert_fail("i <= pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x42f,"Abc_Cex_t *Saig_PhaseTranslateCex(Aig_Man_t *, Abc_Cex_t *)");
    }
  }
  else {
    printf("The PI count in the AIG and in the CEX do not match.\n");
    p_local = (Aig_Man_t *)0x0;
  }
  return (Abc_Cex_t *)p_local;
}

Assistant:

Abc_Cex_t * Saig_PhaseTranslateCex( Aig_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    int i, k, iFrame, nFrames;
    // make sure the PI count of the AIG is a multiple of the PI count of the CEX
    // if this is not true, the CEX is not derived as the result of unrolling of pAig
    // or the unrolled CEX went through transformations that change the PI count
    if ( pCex->nPis % Saig_ManPiNum(p) != 0 )
    {
        printf( "The PI count in the AIG and in the CEX do not match.\n" );
        return NULL;
    }
    // get the number of unrolled frames
    nFrames = pCex->nPis / Saig_ManPiNum(p);
    // get the frame where it fails
    iFrame = pCex->iFrame * nFrames + pCex->iPo / Saig_ManPoNum(p);
    // start a new CEX (assigns: p->nRegs, p->nPis, p->nBits)
    pNew = Abc_CexAlloc( Saig_ManRegNum(p), Saig_ManPiNum(p), iFrame+1 );
    assert( pNew->nBits == pNew->nPis * (iFrame + 1) + pNew->nRegs );
    // now assign the failed frame and the failed PO (p->iFrame and p->iPo)
    pNew->iFrame = iFrame;
    pNew->iPo    = pCex->iPo % Saig_ManPoNum(p);
    // copy the bit data
    for ( i = pCex->nRegs, k = pNew->nRegs; k < pNew->nBits; k++, i++ )
        if ( Abc_InfoHasBit( pCex->pData, i ) )
            Abc_InfoSetBit( pNew->pData, k );
    assert( i <= pCex->nBits );
    return pNew;
}